

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test::
~TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test
          (TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test *this)

{
  TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test *this_local;
  
  ~TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, sequenceNumbersOfMemoryLeaks)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 1);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 2);
    char* mem3 = detector->allocMemory(defaultNewAllocator(), 3);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Alloc num (2)", output.asCharString());
    STRCMP_CONTAINS("Alloc num (3)", output.asCharString());

    PlatformSpecificFree(mem);
    PlatformSpecificFree(mem2);
    PlatformSpecificFree(mem3);
}